

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O0

void __thiscall Material::UpdateFrom(Material *this,Position *pos)

{
  Board *pBVar1;
  Piece *pPVar2;
  int local_23c;
  int p;
  Piece *pPiece;
  undefined1 local_228 [4];
  uint square;
  Board board;
  Position *pos_local;
  Material *this_local;
  
  board.super_BoardPieceSquare.super_BoardHashing.m_Hash = (HashValue)pos;
  Initialize(this);
  pBVar1 = Position::GetBoard((Position *)board.super_BoardPieceSquare.super_BoardHashing.m_Hash);
  Board::Board((Board *)local_228,pBVar1);
  pPiece._4_4_ = 0;
  do {
    if (0x3f < pPiece._4_4_) {
      return;
    }
    pPVar2 = BoardBase::Get((BoardBase *)local_228,pPiece._4_4_);
    for (local_23c = 0; local_23c < 0xc; local_23c = local_23c + 1) {
      if ((pPVar2 != &None.super_Piece) && (pPVar2 == AllPieces[local_23c])) {
        this->m_nCount[local_23c] = this->m_nCount[local_23c] + 1;
        break;
      }
    }
    pPiece._4_4_ = pPiece._4_4_ + 1;
  } while( true );
}

Assistant:

void Material::UpdateFrom( const Position &pos )
{
    Initialize();
    Board board = pos.GetBoard();
    for ( unsigned int square = 0; square < MAX_SQUARES; square++ )
    {
        const Piece *pPiece = board.Get( square );
        for ( int p = 0; p < AllPiecesSize; p++ )
        {
            if ( pPiece == &None )
                continue;

            if ( pPiece == AllPieces[p] )
            {
                m_nCount[p]++;
                break;
            }
        }
    }
}